

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_api.c
# Opt level: O2

int chain_and_assign_src_ip(pcp_server_t *s,void *data)

{
  ushort uVar1;
  ushort uVar2;
  uint32_t uVar3;
  sockaddr *src;
  undefined8 uVar4;
  undefined4 uVar5;
  pcp_flow_t *f;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined4 *puVar10;
  flow_key_data *pfVar11;
  int iVar12;
  bool bVar13;
  flow_key_data kd;
  char dst_buf [46];
  timeval curtime;
  char src_buf [46];
  char local_68 [8];
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined6 uStack_50;
  undefined2 local_4a;
  undefined6 uStack_48;
  undefined8 uStack_42;
  
  puVar10 = *data;
  pfVar11 = &kd;
  for (lVar8 = 0x13; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(undefined4 *)pfVar11 = *puVar10;
    puVar10 = puVar10 + 1;
    pfVar11 = (flow_key_data *)&pfVar11->src_ip;
  }
  iVar12 = 0;
  if (s->server_state != pss_not_working) {
    if ((((kd.src_ip.__in6_u.__u6_addr32[0] == 0 && kd.src_ip.__in6_u.__u6_addr32[1] == 0) &&
         kd.src_ip.__in6_u.__u6_addr32[2] == 0) && kd.src_ip.__in6_u.__u6_addr32[3] == 0) ||
       (uVar5 = kd.src_ip.__in6_u.__u6_addr32[1], uVar4 = kd.src_ip.__in6_u._0_8_,
       (kd.src_ip.__in6_u.__u6_addr32[0] == 0 && kd.src_ip.__in6_u.__u6_addr32[1] == 0) &&
       (kd.src_ip.__in6_u.__u6_addr32[3] == 0 && kd.src_ip.__in6_u.__u6_addr32[2] == 0xffff0000))) {
      uVar4 = *(undefined8 *)s->src_ip;
      kd.src_ip.__in6_u._8_8_ = *(undefined8 *)(s->src_ip + 2);
      kd.scope_id = s->pcp_scope_id;
      kd.src_ip.__in6_u.__u6_addr32[0] = (uint32_t)uVar4;
      kd.src_ip.__in6_u.__u6_addr32[1] = (uint32_t)((ulong)uVar4 >> 0x20);
      uVar5 = kd.src_ip.__in6_u.__u6_addr32[1];
    }
    kd.src_ip.__in6_u._0_8_ = uVar4;
    bVar13 = kd.src_ip.__in6_u.__u6_addr32[0] == 0;
    if (((bVar13) && (uVar5 == 0)) && (kd.src_ip.__in6_u.__u6_addr32[2] == 0xffff0000)) {
      if (s->src_ip[0] != 0) {
        return 0;
      }
      if (s->src_ip[1] != 0) {
        return 0;
      }
      if (s->src_ip[2] != 0xffff0000) {
        return 0;
      }
    }
    else if (((s->src_ip[0] == 0) && (s->src_ip[1] == 0)) && (s->src_ip[2] == 0xffff0000)) {
      return 0;
    }
    iVar12 = 0;
    if (kd.scope_id == s->pcp_scope_id) {
      kd.pcp_server_ip.__in6_u._0_8_ = *(undefined8 *)s->pcp_ip;
      kd.pcp_server_ip.__in6_u._8_8_ = *(undefined8 *)(s->pcp_ip + 2);
      kd.nonce.n._0_8_ = *(undefined8 *)(s->nonce).n;
      kd.nonce.n[2] = (s->nonce).n[2];
      f = pcp_create_flow(s,&kd);
      if (f == (pcp_flow_t *)0x0) {
        iVar12 = 1;
      }
      else {
        if (kd.operation == '\x03') {
          (f->field_5).sadscp.toler_fields = *(uint8_t *)((long)data + 0x28);
          if (*(char **)((long)data + 0x30) == (char *)0x0) {
            (f->field_5).sadscp.app_name_length = '\0';
            pcVar7 = (char *)0x0;
          }
          else {
            sVar6 = strlen(*(char **)((long)data + 0x30));
            (f->field_5).sadscp.app_name_length = (uint8_t)sVar6;
            pcVar7 = strdup(*(char **)((long)data + 0x30));
          }
          f->sadscp_app_name = pcVar7;
        }
        uVar3 = *(uint32_t *)((long)data + 0x18);
        src = *(sockaddr **)((long)data + 0x20);
        f->ctx = s->ctx;
        if ((byte)((f->kd).operation - 1) < 2) {
          pcp_fill_in6_addr(&(f->field_5).map_peer.ext_ip,&(f->field_5).map_peer.ext_port,
                            (uint32_t *)0x0,src);
        }
        else if (src != (sockaddr *)0x0) {
          __assert_fail("!ext_addr",
                        "/workspace/llm4binary/github/license_c_cmakelists/libpcp[P]pcp/lib/src/pcp_api.c"
                        ,299,"void init_flow(pcp_flow_t *, pcp_server_t *, int, struct sockaddr *)")
          ;
        }
        iVar12 = 0;
        gettimeofday((timeval *)&curtime,(__timezone_ptr_t)0x0);
        f->lifetime = uVar3;
        (f->timeout).tv_sec = curtime.tv_sec;
        (f->timeout).tv_usec = curtime.tv_usec;
        f->state = (uint)(s->server_state == pss_wait_io) + pfs_wait_for_server_init;
        (s->next_timeout).tv_sec = curtime.tv_sec;
        (s->next_timeout).tv_usec = curtime.tv_usec;
        f->user_data = (void *)0x0;
        pcp_db_add_flow(f);
        if (PCP_LOGLVL_WARN < pcp_log_level) {
          src_buf[0x20] = '\0';
          src_buf[0x21] = '\0';
          src_buf[0x22] = '\0';
          src_buf[0x23] = '\0';
          src_buf[0x24] = '\0';
          src_buf[0x25] = '\0';
          src_buf[0x26] = '\0';
          src_buf[0x27] = '\0';
          src_buf[0x28] = '\0';
          src_buf[0x29] = '\0';
          src_buf[0x2a] = '\0';
          src_buf[0x2b] = '\0';
          src_buf[0x2c] = '\0';
          src_buf[0x2d] = '\0';
          src_buf[0x10] = '\0';
          src_buf[0x11] = '\0';
          src_buf[0x12] = '\0';
          src_buf[0x13] = '\0';
          src_buf[0x14] = '\0';
          src_buf[0x15] = '\0';
          src_buf[0x16] = '\0';
          src_buf[0x17] = '\0';
          src_buf[0x18] = '\0';
          src_buf[0x19] = '\0';
          src_buf[0x1a] = '\0';
          src_buf[0x1b] = '\0';
          src_buf[0x1c] = '\0';
          src_buf[0x1d] = '\0';
          src_buf[0x1e] = '\0';
          src_buf[0x1f] = '\0';
          builtin_strncpy(src_buf,"Unknown",8);
          src_buf[8] = '\0';
          src_buf[9] = '\0';
          src_buf[10] = '\0';
          src_buf[0xb] = '\0';
          src_buf[0xc] = '\0';
          src_buf[0xd] = '\0';
          src_buf[0xe] = '\0';
          src_buf[0xf] = '\0';
          dst_buf[0x20] = '\0';
          dst_buf[0x21] = '\0';
          dst_buf[0x22] = '\0';
          dst_buf[0x23] = '\0';
          dst_buf[0x24] = '\0';
          dst_buf[0x25] = '\0';
          dst_buf[0x26] = '\0';
          dst_buf[0x27] = '\0';
          dst_buf[0x28] = '\0';
          dst_buf[0x29] = '\0';
          dst_buf[0x2a] = '\0';
          dst_buf[0x2b] = '\0';
          dst_buf[0x2c] = '\0';
          dst_buf[0x2d] = '\0';
          dst_buf[0x10] = '\0';
          dst_buf[0x11] = '\0';
          dst_buf[0x12] = '\0';
          dst_buf[0x13] = '\0';
          dst_buf[0x14] = '\0';
          dst_buf[0x15] = '\0';
          dst_buf[0x16] = '\0';
          dst_buf[0x17] = '\0';
          dst_buf[0x18] = '\0';
          dst_buf[0x19] = '\0';
          dst_buf[0x1a] = '\0';
          dst_buf[0x1b] = '\0';
          dst_buf[0x1c] = '\0';
          dst_buf[0x1d] = '\0';
          dst_buf[0x1e] = '\0';
          dst_buf[0x1f] = '\0';
          builtin_strncpy(dst_buf,"Unknown",8);
          dst_buf[8] = '\0';
          dst_buf[9] = '\0';
          dst_buf[10] = '\0';
          dst_buf[0xb] = '\0';
          dst_buf[0xc] = '\0';
          dst_buf[0xd] = '\0';
          dst_buf[0xe] = '\0';
          dst_buf[0xf] = '\0';
          uStack_48 = 0;
          uStack_42 = 0;
          uStack_58 = 0;
          uStack_50 = 0;
          local_4a = 0;
          builtin_strncpy(local_68,"Unknown",8);
          uStack_60 = 0;
          inet_ntop(10,&(f->kd).src_ip,src_buf,0x2e);
          inet_ntop(10,(void *)((long)&(f->kd).field_5 + 4),dst_buf,0x2e);
          inet_ntop(10,&(f->kd).pcp_server_ip,local_68,0x2e);
          uVar1 = (f->kd).field_5.map_peer.src_port;
          uVar2 = (f->kd).field_5.map_peer.dst_port;
          pcp_logger(PCP_LOGLVL_INFO,
                     "%s(PCP server: %s; Int. addr: [%s]:%d; ScopeId: %u; Dest. addr: [%s]:%d; Key bucket: %d)"
                     ,"Added new flow",local_68,src_buf,(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8),
                     (ulong)(f->kd).scope_id,dst_buf,(ulong)(ushort)(uVar2 << 8 | uVar2 >> 8),
                     (ulong)f->key_bucket);
        }
        f->user_data = *(void **)((long)data + 0x38);
        puVar9 = (undefined8 *)(*(long *)((long)data + 8) + 0x98);
        if (*(long *)((long)data + 8) == 0) {
          puVar9 = (undefined8 *)((long)data + 0x10);
        }
        *puVar9 = f;
        *(pcp_flow_t **)((long)data + 8) = f;
      }
    }
  }
  return iVar12;
}

Assistant:

static int chain_and_assign_src_ip(pcp_server_t *s, void *data) {
    struct caasi_data *d = (struct caasi_data *)data;
    struct flow_key_data kd = *d->kd;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    if (s->server_state == pss_not_working) {
        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return 0;
    }

    pcp_flow_t *f = NULL;

    if (IPV6_IS_ADDR_ANY(&kd.src_ip)) {
        memcpy(&kd.src_ip, s->src_ip, sizeof(kd.src_ip));
        kd.scope_id = s->pcp_scope_id;
    }

    // check address family
    if (!have_same_af(&kd.src_ip, (struct in6_addr *)s->src_ip)) {
        return 0;
    }

    // check matching scope
    if (kd.scope_id != s->pcp_scope_id) {
        return 0;
    }

    memcpy(&kd.pcp_server_ip, s->pcp_ip, sizeof(kd.pcp_server_ip));
    memcpy(&kd.nonce, &s->nonce, sizeof(kd.nonce));
    f = pcp_create_flow(s, &kd);
    if (!f) {
        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return 1;
    }
#ifdef PCP_SADSCP
    if (kd.operation == PCP_OPCODE_SADSCP) {
        f->sadscp.toler_fields = d->toler_fields;
        if (d->app_name) {
            f->sadscp.app_name_length = strlen(d->app_name);
            f->sadscp_app_name = strdup(d->app_name);
        } else {
            f->sadscp.app_name_length = 0;
            f->sadscp_app_name = NULL;
        }
    }
#endif
    init_flow(f, s, d->lifetime, d->ext_addr);
    f->user_data = d->userdata;
    if (d->fprev) {
        d->fprev->next_child = f;
    } else {
        d->ffirst = f;
    }
    d->fprev = f;

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return 0;
}